

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam.cpp
# Opt level: O0

void LoadParameters(string *file_name)

{
  byte bVar1;
  bool bVar2;
  ostream *this;
  FileNode local_2f0 [24];
  FileNode local_2d8 [24];
  FileNode local_2c0 [24];
  FileNode local_2a8 [24];
  FileNode local_290 [24];
  FileNode local_278 [24];
  MatExpr local_260 [352];
  FileNode local_100 [24];
  FileNode local_e8 [24];
  FileNode local_d0 [24];
  FileNode local_b8 [24];
  FileNode local_a0 [28];
  Size_<int> local_84;
  Size cap_size;
  string local_70 [32];
  FileStorage local_50 [8];
  FileStorage fs;
  string *file_name_local;
  
  std::__cxx11::string::string(local_70);
  cv::FileStorage::FileStorage(local_50,(string *)file_name,0,local_70);
  std::__cxx11::string::~string(local_70);
  bVar1 = cv::FileStorage::isOpened();
  if ((bVar1 & 1) != 0) {
    cv::Size_<int>::Size_(&local_84);
    cv::FileStorage::operator[]((char *)local_a0);
    cv::operator>>(local_a0,&cam_model_abi_cxx11_);
    cv::FileStorage::operator[]((char *)local_b8);
    cv::operator>>(local_b8,&local_84);
    cv::FileStorage::operator[]((char *)local_d0);
    cv::operator>>(local_d0,(Mat *)Kl);
    cv::FileStorage::operator[]((char *)local_e8);
    cv::operator>>(local_e8,(Mat *)Dl);
    cv::FileStorage::operator[]((char *)local_100);
    cv::operator>>(local_100,(Mat *)xil);
    cv::Mat::eye((int)local_260,3,3);
    cv::Mat::operator=((Mat *)Rl,local_260);
    cv::MatExpr::~MatExpr(local_260);
    bVar2 = std::operator==(&cam_model_abi_cxx11_,"stereo");
    if (bVar2) {
      cv::FileStorage::operator[]((char *)local_278);
      cv::operator>>(local_278,(Mat *)Rl);
      cv::FileStorage::operator[]((char *)local_290);
      cv::operator>>(local_290,(Mat *)Kr);
      cv::FileStorage::operator[]((char *)local_2a8);
      cv::operator>>(local_2a8,(Mat *)Dr);
      cv::FileStorage::operator[]((char *)local_2c0);
      cv::operator>>(local_2c0,(Mat *)xir);
      cv::FileStorage::operator[]((char *)local_2d8);
      cv::operator>>(local_2d8,(Mat *)Rr);
      cv::FileStorage::operator[]((char *)local_2f0);
      cv::operator>>(local_2f0,(Mat *)Translation);
    }
    cv::FileStorage::release();
    img_width = local_84.width;
    cap_cols = local_84.width;
    cap_rows = local_84.height;
    bVar2 = std::operator==(&cam_model_abi_cxx11_,"stereo");
    if (bVar2) {
      img_width = local_84.width / 2;
    }
    cv::FileStorage::~FileStorage(local_50);
    return;
  }
  this = std::operator<<((ostream *)&std::cout,"Failed to open ini parameters");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

void LoadParameters(std::string file_name) {
  cv::FileStorage fs(file_name, cv::FileStorage::READ);
  if (!fs.isOpened()) {
    std::cout << "Failed to open ini parameters" << std::endl;
    exit(-1);
  }

  cv::Size cap_size;
  fs["cam_model"] >> cam_model;
  fs["cap_size" ] >> cap_size;
  fs["Kl"       ] >> Kl;
  fs["Dl"       ] >> Dl;
  fs["xil"      ] >> xil;
  Rl = cv::Mat::eye(3, 3, CV_64F);
  if (cam_model == "stereo") {
    fs["Rl"       ] >> Rl;
    fs["Kr"       ] >> Kr;
    fs["Dr"       ] >> Dr;
    fs["xir"      ] >> xir;
    fs["Rr"       ] >> Rr;
    fs["T"        ] >> Translation;
  }
  fs.release();

  img_width = cap_size.width;
  cap_cols  = cap_size.width;
  cap_rows  = cap_size.height;

  if (cam_model == "stereo")
    img_width  = cap_size.width / 2;
}